

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  __pid_t _Var2;
  __pid_t _Var3;
  int fd;
  int **sv;
  int *piVar4;
  undefined8 *puVar5;
  ostream *poVar6;
  long lVar7;
  int i_1;
  int i_2;
  ulong uVar8;
  int i;
  long lVar9;
  char buf [1];
  int clientfd;
  string result_str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  request;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  table;
  string local_b8;
  char message [64];
  string local_50;
  
  sv = (int **)operator_new__(0x20);
  for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
    piVar4 = (int *)operator_new__(8);
    sv[lVar9] = piVar4;
  }
  table._M_h._M_buckets = &table._M_h._M_single_bucket;
  table._M_h._M_bucket_count = 1;
  table._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  table._M_h._M_element_count = 0;
  table._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  table._M_h._M_rehash_policy._M_next_resize = 0;
  table._M_h._M_single_bucket = (__node_base_ptr)0x0;
  lVar9 = 0;
  do {
    if (lVar9 == 4) {
      _Var2 = getpid();
      puVar5 = (undefined8 *)mmap((void *)0x0,0x10,3,0x21,-1,0);
      if (puVar5 != (undefined8 *)0x0) {
        *puVar5 = 0;
        puVar5[1] = 0;
        lVar9 = 0;
        while( true ) {
          _Var3 = getpid();
          if (lVar9 == 4) break;
          if (_Var3 == _Var2) {
            _Var3 = fork();
            if (_Var3 != 0) {
              if (_Var3 < 0) {
                perror("fork failed");
              }
              else {
                *(__pid_t *)((long)puVar5 + lVar9 * 4) = _Var3;
                sleep(1);
              }
            }
          }
          lVar9 = lVar9 + 1;
        }
        if (_Var3 != _Var2) {
          lVar9 = 0;
          while( true ) {
            if (lVar9 == 4) {
              std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::~_Hashtable(&table._M_h);
              return 0;
            }
            _Var2 = getpid();
            if (_Var2 == *(int *)((long)puVar5 + lVar9 * 4)) break;
            lVar9 = lVar9 + 1;
          }
          poVar6 = std::operator<<((ostream *)&std::cout,"Work child N ");
          _Var2 = getpid();
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,_Var2);
          std::operator<<(poVar6,'\n');
          workercloser((int)lVar9,sv);
          piVar4 = sv[lVar9];
          close(piVar4[1]);
          do {
            buf[0] = 'a';
            sock_fd_read(*piVar4,buf,1,&clientfd);
            recv(clientfd,message,0x40,0x4000);
            poVar6 = std::operator<<((ostream *)&std::cout,"Child proccess N ");
            _Var2 = getpid();
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,_Var2);
            poVar6 = std::operator<<(poVar6," > ");
            poVar6 = std::operator<<(poVar6,message);
            std::operator<<(poVar6,'\n');
            std::__cxx11::string::string((string *)&local_b8,message,(allocator *)&result_str);
            request_parse(&request,&local_b8);
            std::__cxx11::string::~string((string *)&local_b8);
            lVar9 = 0;
            for (uVar8 = 0;
                uVar8 < (ulong)((long)request.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)request.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5);
                uVar8 = uVar8 + 1) {
              poVar6 = std::operator<<((ostream *)&std::cout,
                                       (string *)
                                       ((long)&((request.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               _M_dataplus)._M_p + lVar9));
              std::operator<<(poVar6,' ');
              lVar9 = lVar9 + 0x20;
            }
            poVar6 = std::operator<<((ostream *)&std::cout,"|");
            std::endl<char,std::char_traits<char>>(poVar6);
            result_str._M_dataplus._M_p = (pointer)&result_str.field_2;
            result_str._M_string_length = 0;
            result_str.field_2._M_local_buf[0] = '\0';
            result_message(&local_50,&table,&request);
            std::__cxx11::string::operator=((string *)&result_str,(string *)&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            poVar6 = std::operator<<((ostream *)&std::cout,"RESULT VALUE ");
            poVar6 = std::operator<<(poVar6,(string *)&result_str);
            std::operator<<(poVar6,'\n');
            send(clientfd,result_str._M_dataplus._M_p,result_str._M_string_length,0x4000);
            shutdown(clientfd,2);
            close(clientfd);
            std::__cxx11::string::~string((string *)&result_str);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&request);
          } while( true );
        }
        for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
          close(*sv[lVar9]);
        }
        message[0] = '\x02';
        message[1] = '\0';
        message[2] = '#';
        message[3] = '(';
        message[4] = '\0';
        message[5] = '\0';
        message[6] = '\0';
        message[7] = '\0';
        iVar1 = socket(2,1,0);
        bind(iVar1,(sockaddr *)message,0x10);
        listen(iVar1,5);
        result_str._M_dataplus._M_p._0_1_ = 0x61;
        lVar9 = 0;
        do {
          do {
            lVar7 = lVar9;
            lVar9 = 0;
          } while (lVar7 == 4);
          fd = accept(iVar1,(sockaddr *)0x0,(socklen_t *)0x0);
          sock_fd_write(sv[lVar7][1],&result_str,1,fd);
          close(fd);
          lVar9 = lVar7 + 1;
        } while( true );
      }
      perror("mmap failed");
LAB_00106d93:
      exit(1);
    }
    iVar1 = socketpair(1,1,0,sv[lVar9]);
    if (iVar1 < 0) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"socketpair");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)lVar9);
      std::operator<<(poVar6,'\n');
      goto LAB_00106d93;
    }
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {


    try{


        int **sv = new int*[4];
        for(int i=0; i<4;i++){
            sv[i] = new int[2];
        }

        std::unordered_map<std::string, std::string> table;
    


        for(int i =0; i <4; i++){
            if(socketpair(AF_LOCAL, SOCK_STREAM, 0, sv[i]) < 0){
                std::cerr <<"socketpair" <<i <<'\n';
                exit(1);
            }
        }

        int pid;

        pid_t masterProc = getpid();

        pid_t *worker;

        worker =(pid_t *)mmap(0, MAX_PIDS*sizeof(pid_t),
                              PROT_READ|PROT_WRITE,
                              MAP_SHARED | MAP_ANONYMOUS, -1, 0);

        if(!worker){
            perror("mmap failed");
            exit(1);
        }

        memset((void *)worker, 0, MAX_PIDS*sizeof(pid_t));

        for(int i =0; i<4; i++){
            if(getpid() == masterProc){
                pid = fork();
                if(pid == 0){
                    continue;
                    //exit(0);
                }else if(pid < 0){
                    perror("fork failed");
                }else{
                    worker[i] = pid;
                    sleep(1);
                }
            }
        }

        if(getpid() == masterProc){

            for(int i=0;i < 4; i++){
                close(sv[i][0]);
            }

            //for(int i =0; i < 4; i++)
            //  printf("this child N %d\n", worker[i]);

            int listenfd, clientfd;

            struct sockaddr_in serv;
            serv.sin_family = AF_INET;
            serv.sin_port = htons(9000);
            serv.sin_addr.s_addr = INADDR_ANY;

            listenfd = socket(AF_INET, SOCK_STREAM, 0);

            bind(listenfd, (struct sockaddr *)&serv, sizeof(serv));

            listen(listenfd, 5);

            char mesage[1] ={'a'};


            while(true){
                for(int i = 0; i < 4 ; i++){
                    clientfd = accept(listenfd,NULL,NULL);
                    sock_fd_write(sv[i][1], mesage, 1, clientfd);
                    close(clientfd);
                    //reload session
                }
            }
            close(listenfd);
            int stat;
            for(int i=0; i < 4 ; i++){
                waitpid(worker[i],&stat,0);
            }


        }

        else{
            for(int i =0; i <4; i++){
                if(getpid() == worker[i]){
                    std::cout << "Work child N " <<getpid() <<'\n';
                    workercloser(i, sv);
                    close(sv[i][1]);

                    int clientfd;


                    for(;;){
                        char buf[1] = {'a'};
                        sock_fd_read(sv[i][0], buf, 1, &clientfd);

                        char message[64];
                        recv(clientfd, message, sizeof(message),
                             MSG_NOSIGNAL);

                     //   std::cout <<"YA PRINAL\n";
                        std::cout << "Child proccess N " <<getpid() << " > "
                                  << message <<'\n';

                        std::vector<std::string> request = request_parse(message);
                        for(int i=0;i < request.size();i++){
                            std::cout <<request[i] <<' ';
                        }std::cout <<"|" <<std::endl;
                        std::string result_str;
                        result_str = result_message(table, request);


                        std::cout << "RESULT VALUE " <<result_str << '\n';
                        send(clientfd, result_str.c_str(), result_str.length(), MSG_NOSIGNAL);

                        shutdown(clientfd, SHUT_RDWR);
                        close(clientfd);
                        //reload session
                    }
                }

            }
        }


    }catch(std::exception &e){
        std::cerr << "Exception " <<e.what() <<std::endl;
    }

    





    return 0;
}